

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz.h
# Opt level: O0

ZZ<8UL> * __thiscall GF2::ZZ<8UL>::operator+=(ZZ<8UL> *this,word wRight)

{
  ulong uVar1;
  word wVar2;
  ulong in_RSI;
  WW<8UL> *in_RDI;
  bool bVar3;
  size_t pos;
  long local_18;
  
  uVar1 = in_RSI + in_RDI->_words[0];
  in_RDI->_words[0] = uVar1;
  if (uVar1 < in_RSI) {
    local_18 = 1;
    while( true ) {
      bVar3 = false;
      if (local_18 == 0) {
        wVar2 = in_RDI->_words[0] + 1;
        in_RDI->_words[0] = wVar2;
        bVar3 = wVar2 == 0;
      }
      if (!bVar3) break;
      local_18 = local_18 + 1;
    }
  }
  WW<8UL>::Trim(in_RDI);
  return (ZZ<8UL> *)in_RDI;
}

Assistant:

ZZ& operator+=(word wRight)
	{	
		if ((_words[0] += wRight) < wRight)
		{
			size_t pos = 1;
			for (; pos < _wcount && ++_words[pos] == 0; ++pos);
		}
		Trim();
		return *this;
	}